

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O1

void __thiscall
TPZMHMeshControl::DefinePartitionbyCoarseIndices(TPZMHMeshControl *this,TPZVec<long> *coarseindices)

{
  int64_t newsize;
  long *plVar1;
  long lVar2;
  int64_t in_RAX;
  TPZGeoEl **ppTVar3;
  mapped_type_conflict *pmVar4;
  TPZGeoEl *this_00;
  long lVar5;
  long lVar6;
  int64_t local_38;
  
  lVar6 = coarseindices->fNElements;
  newsize = (((this->fGMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.
            fNElements;
  local_38 = in_RAX;
  TPZManVector<long,_10>::Resize(&this->fGeoToMHMDomain,newsize);
  if (0 < newsize) {
    memset((this->fGeoToMHMDomain).super_TPZVec<long>.fStore,0xff,newsize * 8);
  }
  if (0 < lVar6) {
    lVar5 = 0;
    do {
      plVar1 = coarseindices->fStore;
      lVar2 = plVar1[lVar5];
      (this->fGeoToMHMDomain).super_TPZVec<long>.fStore[lVar2] = lVar2;
      ppTVar3 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,plVar1[lVar5]);
      if (*ppTVar3 != (TPZGeoEl *)0x0) {
        local_38 = (*ppTVar3)->fIndex;
        pmVar4 = std::
                 map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
                 operator[](&this->fMHMtoSubCMesh,&local_38);
        *pmVar4 = -1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
  }
  if (0 < newsize) {
    lVar6 = 0;
    do {
      ppTVar3 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,lVar6);
      if ((*ppTVar3 != (TPZGeoEl *)0x0) &&
         ((this->fGeoToMHMDomain).super_TPZVec<long>.fStore[lVar6] == -1)) {
        for (this_00 = TPZGeoEl::Father(*ppTVar3); this_00 != (TPZGeoEl *)0x0;
            this_00 = TPZGeoEl::Father(this_00)) {
          plVar1 = (this->fGeoToMHMDomain).super_TPZVec<long>.fStore;
          lVar5 = plVar1[this_00->fIndex];
          if (lVar5 != -1) {
            plVar1[lVar6] = lVar5;
            break;
          }
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != newsize);
  }
  (*this->_vptr_TPZMHMeshControl[5])(this);
  return;
}

Assistant:

void TPZMHMeshControl::DefinePartitionbyCoarseIndices(TPZVec<int64_t> &coarseindices)
{
    int64_t ncoarse = coarseindices.size();
    int64_t nel = fGMesh->NElements();
    fGeoToMHMDomain.Resize(nel);
    for (int64_t el=0; el<nel; el++) {
        fGeoToMHMDomain[el] = -1;
    }
    for (int64_t el=0; el<ncoarse; el++) {
        fGeoToMHMDomain[coarseindices[el]] = coarseindices[el];
        TPZGeoEl *gel = fGMesh->Element(coarseindices[el]);
        if (gel) {
            fMHMtoSubCMesh[gel->Index()] = -1;
        }
    }
    // set the MHM domain index for all elements
    // look for a father element that has a MHM domain index
    // adopt the domain index of the ancester
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || fGeoToMHMDomain[el] != -1) {
            continue;
        }
        int domain = -1;
        TPZGeoEl *father = gel->Father();
        while (father) {
            int64_t index = father->Index();
            if (fGeoToMHMDomain[index] != -1) {
                fGeoToMHMDomain[el] = fGeoToMHMDomain[index];
                break;
            }
            father = father->Father();
        }
    }
    CreateSkeletonElements();
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Subdomain indices " << fGeoToMHMDomain << std::endl;
        sout << "Recognized domains ";
        for (auto it = fMHMtoSubCMesh.begin(); it != fMHMtoSubCMesh.end(); it++) {
            sout << it->first << ' ';
        }
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
}